

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::StairsRenderer<ImPlot::GetterYs<float>,_ImPlot::TransformerLogLin>::operator()
          (StairsRenderer<ImPlot::GetterYs<float>,_ImPlot::TransformerLogLin> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  ImVec2 IVar1;
  ImU32 IVar2;
  uint uVar3;
  GetterYs<float> *pGVar4;
  TransformerLogLin *pTVar5;
  ImPlotPlot *pIVar6;
  ImDrawVert *pIVar7;
  uint *puVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [12];
  double dVar11;
  ImPlotContext *pIVar12;
  int iVar13;
  double dVar14;
  ImVec2 IVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  pIVar12 = GImPlot;
  pGVar4 = this->Getter;
  pTVar5 = this->Transformer;
  iVar13 = pGVar4->Count;
  fVar18 = *(float *)((long)pGVar4->Ys +
                     (long)(((prim + 1 + pGVar4->Offset) % iVar13 + iVar13) % iVar13) *
                     (long)pGVar4->Stride);
  dVar14 = log10(((double)(prim + 1) * pGVar4->XScale + pGVar4->X0) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar6 = pIVar12->CurrentPlot;
  dVar11 = (pIVar6->XAxis).Range.Min;
  iVar13 = pTVar5->YAxis;
  IVar1 = pIVar12->PixelRange[iVar13].Min;
  IVar15.x = (float)(pIVar12->Mx *
                     (((double)(float)(dVar14 / pIVar12->LogDenX) *
                       ((pIVar6->XAxis).Range.Max - dVar11) + dVar11) - dVar11) + (double)IVar1.x);
  IVar15.y = (float)(pIVar12->My[iVar13] * ((double)fVar18 - pIVar6->YAxis[iVar13].Range.Min) +
                    (double)IVar1.y);
  fVar16 = (this->P1).x;
  fVar17 = (this->P1).y;
  auVar19._0_4_ = ~-(uint)(IVar15.x <= fVar16) & (uint)IVar15.x;
  auVar19._4_4_ = ~-(uint)(IVar15.y <= fVar17) & (uint)IVar15.y;
  auVar19._8_4_ = ~-(uint)(fVar16 < IVar15.x) & (uint)IVar15.x;
  auVar19._12_4_ = ~-(uint)(fVar17 < IVar15.y) & (uint)IVar15.y;
  auVar9._4_4_ = (uint)fVar17 & -(uint)(IVar15.y <= fVar17);
  auVar9._0_4_ = (uint)fVar16 & -(uint)(IVar15.x <= fVar16);
  auVar9._8_4_ = (uint)fVar16 & -(uint)(fVar16 < IVar15.x);
  auVar9._12_4_ = (uint)fVar17 & -(uint)(fVar17 < IVar15.y);
  auVar19 = auVar19 | auVar9;
  fVar18 = (cull_rect->Min).y;
  auVar10._4_8_ = auVar19._8_8_;
  auVar10._0_4_ = -(uint)(auVar19._4_4_ < fVar18);
  auVar20._0_8_ = auVar10._0_8_ << 0x20;
  auVar20._8_4_ = -(uint)(auVar19._8_4_ < (cull_rect->Max).x);
  auVar20._12_4_ = -(uint)(auVar19._12_4_ < (cull_rect->Max).y);
  auVar21._4_4_ = -(uint)(fVar18 < auVar19._4_4_);
  auVar21._0_4_ = -(uint)((cull_rect->Min).x < auVar19._0_4_);
  auVar21._8_8_ = auVar20._8_8_;
  iVar13 = movmskps((int)pIVar6,auVar21);
  if (iVar13 == 0xf) {
    fVar18 = fVar17 + this->HalfWeight;
    fVar17 = fVar17 - this->HalfWeight;
    IVar2 = this->Col;
    IVar1 = *uv;
    pIVar7 = DrawList->_VtxWritePtr;
    (pIVar7->pos).x = fVar16;
    (pIVar7->pos).y = fVar18;
    DrawList->_VtxWritePtr->uv = IVar1;
    pIVar7 = DrawList->_VtxWritePtr;
    pIVar7->col = IVar2;
    pIVar7[1].pos.x = IVar15.x;
    pIVar7[1].pos.y = fVar17;
    DrawList->_VtxWritePtr[1].uv = IVar1;
    pIVar7 = DrawList->_VtxWritePtr;
    pIVar7[1].col = IVar2;
    pIVar7[2].pos.x = fVar16;
    pIVar7[2].pos.y = fVar17;
    pIVar7[2].uv = IVar1;
    pIVar7 = DrawList->_VtxWritePtr;
    pIVar7[2].col = IVar2;
    pIVar7[3].pos.x = IVar15.x;
    pIVar7[3].pos.y = fVar18;
    pIVar7[3].uv = IVar1;
    pIVar7 = DrawList->_VtxWritePtr;
    pIVar7[3].col = IVar2;
    DrawList->_VtxWritePtr = pIVar7 + 4;
    uVar3 = DrawList->_VtxCurrentIdx;
    puVar8 = DrawList->_IdxWritePtr;
    *puVar8 = uVar3;
    puVar8[1] = uVar3 + 1;
    puVar8[2] = DrawList->_VtxCurrentIdx + 2;
    uVar3 = DrawList->_VtxCurrentIdx;
    puVar8[3] = uVar3;
    puVar8[4] = uVar3 + 1;
    puVar8[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar8 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
    fVar17 = IVar15.x - this->HalfWeight;
    fVar16 = this->HalfWeight + IVar15.x;
    fVar18 = (this->P1).y;
    IVar2 = this->Col;
    IVar1 = *uv;
    pIVar7[4].pos.x = fVar17;
    pIVar7[4].pos.y = IVar15.y;
    DrawList->_VtxWritePtr->uv = IVar1;
    pIVar7 = DrawList->_VtxWritePtr;
    pIVar7->col = IVar2;
    pIVar7[1].pos.x = fVar16;
    pIVar7[1].pos.y = fVar18;
    DrawList->_VtxWritePtr[1].uv = IVar1;
    pIVar7 = DrawList->_VtxWritePtr;
    pIVar7[1].col = IVar2;
    pIVar7[2].pos.x = fVar17;
    pIVar7[2].pos.y = fVar18;
    pIVar7[2].uv = IVar1;
    pIVar7 = DrawList->_VtxWritePtr;
    pIVar7[2].col = IVar2;
    pIVar7[3].pos.x = fVar16;
    pIVar7[3].pos.y = IVar15.y;
    pIVar7[3].uv = IVar1;
    pIVar7 = DrawList->_VtxWritePtr;
    pIVar7[3].col = IVar2;
    DrawList->_VtxWritePtr = pIVar7 + 4;
    uVar3 = DrawList->_VtxCurrentIdx;
    puVar8 = DrawList->_IdxWritePtr;
    *puVar8 = uVar3;
    puVar8[1] = uVar3 + 1;
    puVar8[2] = DrawList->_VtxCurrentIdx + 2;
    uVar3 = DrawList->_VtxCurrentIdx;
    puVar8[3] = uVar3;
    puVar8[4] = uVar3 + 1;
    puVar8[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar8 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  }
  this->P1 = IVar15;
  return (char)iVar13 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddRectFilled(ImVec2(P1.x, P1.y + HalfWeight), ImVec2(P2.x, P1.y - HalfWeight), Col, DrawList, uv);
        AddRectFilled(ImVec2(P2.x - HalfWeight, P2.y), ImVec2(P2.x + HalfWeight, P1.y), Col, DrawList, uv);

        // AddLine(P1, P12, Weight, Col, DrawList, uv);
        // AddLine(P12, P2, Weight, Col, DrawList, uv);
        P1 = P2;
        return true;
    }